

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

void Terminate(PaUtilHostApiRepresentation *hostApi)

{
  PaUtilAllocationGroup *group;
  
  if (hostApi != (PaUtilHostApiRepresentation *)0x0) {
    group = (PaUtilAllocationGroup *)hostApi[3].privatePaFrontInfo.baseDeviceIndex;
    if (group != (PaUtilAllocationGroup *)0x0) {
      PaUtil_FreeAllAllocations(group);
      PaUtil_DestroyAllocationGroup
                ((PaUtilAllocationGroup *)hostApi[3].privatePaFrontInfo.baseDeviceIndex);
    }
    PaUtil_FreeMemory(hostApi);
    snd_config_update_free_global();
    return;
  }
  __assert_fail("hostApi",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                ,0x345,"void Terminate(struct PaUtilHostApiRepresentation *)");
}

Assistant:

static void Terminate( struct PaUtilHostApiRepresentation *hostApi )
{
    PaAlsaHostApiRepresentation *alsaHostApi = (PaAlsaHostApiRepresentation*)hostApi;

    assert( hostApi );

    /** See AlsaErrorHandler and PaAlsa_Initialize for details.
    */
    /*snd_lib_error_set_handler(NULL);*/

    if( alsaHostApi->allocations )
    {
        PaUtil_FreeAllAllocations( alsaHostApi->allocations );
        PaUtil_DestroyAllocationGroup( alsaHostApi->allocations );
    }

    PaUtil_FreeMemory( alsaHostApi );
    alsa_snd_config_update_free_global();

    /* Close Alsa library. */
    PaAlsa_CloseLibrary();
}